

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
          (accessor<pybind11::detail::accessor_policies::generic_item> *this,
          accessor<pybind11::detail::accessor_policies::generic_item> *value)

{
  handle local_38;
  PyObject *local_30;
  handle local_28;
  handle local_20;
  accessor<pybind11::detail::accessor_policies::generic_item> *local_18;
  accessor<pybind11::detail::accessor_policies::generic_item> *value_local;
  accessor<pybind11::detail::accessor_policies::generic_item> *this_local;
  
  local_20.m_ptr = (this->obj).m_ptr;
  local_28.m_ptr = (this->key).super_handle.m_ptr;
  local_18 = value;
  value_local = this;
  object_or_cast<pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>,_0>
            (value);
  detail::accessor::operator_cast_to_object((accessor *)&local_38);
  local_30 = local_38.m_ptr;
  accessor_policies::generic_item::set(local_20,local_28,local_38);
  pybind11::object::~object((object *)&local_38);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }